

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whitelist_impl.h
# Opt level: O0

int secp256k1_whitelist_tweak_pubkey(secp256k1_context *ctx,secp256k1_gej *pub_tweaked)

{
  int iVar1;
  undefined1 local_58 [4];
  int ret;
  secp256k1_scalar zero;
  secp256k1_scalar tweak;
  secp256k1_gej *pub_tweaked_local;
  secp256k1_context *ctx_local;
  
  secp256k1_scalar_set_int((secp256k1_scalar *)local_58,0);
  iVar1 = secp256k1_whitelist_hash_pubkey((secp256k1_scalar *)(zero.d + 3),pub_tweaked);
  if (iVar1 != 0) {
    secp256k1_ecmult(&ctx->ecmult_ctx,pub_tweaked,pub_tweaked,(secp256k1_scalar *)(zero.d + 3),
                     (secp256k1_scalar *)local_58);
  }
  return iVar1;
}

Assistant:

static int secp256k1_whitelist_tweak_pubkey(const secp256k1_context* ctx, secp256k1_gej* pub_tweaked) {
    secp256k1_scalar tweak;
    secp256k1_scalar zero;
    int ret;

    secp256k1_scalar_set_int(&zero, 0);

    ret = secp256k1_whitelist_hash_pubkey(&tweak, pub_tweaked);
    if (ret) {
        secp256k1_ecmult(&ctx->ecmult_ctx, pub_tweaked, pub_tweaked, &tweak, &zero);
    }
    return ret;
}